

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

QSize __thiscall QAbstractSpinBox::minimumSizeHint(QAbstractSpinBox *this)

{
  long lVar1;
  long *plVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  QStyle *pQVar9;
  long lVar10;
  long in_FS_OFFSET;
  int local_e0;
  undefined4 local_dc;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QFontMetrics fm;
  QStyleOptionSpinBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)(this + 8);
  if (((int)plVar2[0x6e] < 1) || (*(int *)((long)plVar2 + 0x374) < 1)) {
    QWidget::ensurePolished((QWidget *)this);
    _fm = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)&fm);
    (**(code **)(*(long *)plVar2[0x6f] + 0x78))();
    local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = plVar2 + 0x4b;
    opt.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i._0_2_ =
         0x20;
    QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
              ((QString *)&local_d8,(QStringBuilder<const_QString_&,_char16_t> *)&opt);
    (**(code **)(*plVar2 + 0xd8))(&opt,plVar2,plVar2 + 0x58);
    local_b8.ptr = (char16_t *)opt.super_QStyleOptionComplex.super_QStyleOption._8_8_;
    local_b8.d = (Data *)opt.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    opt.super_QStyleOptionComplex.super_QStyleOption.version = 0;
    opt.super_QStyleOptionComplex.super_QStyleOption.type = 0;
    opt.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    opt.super_QStyleOptionComplex.super_QStyleOption.direction = LeftToRight;
    local_b8.size._0_4_ = opt.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i;
    local_b8.size._4_4_ = opt.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i = 0;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
    QString::truncate((longlong)&local_b8);
    QString::append((QString *)&local_b8);
    iVar8 = (int)&local_b8;
    iVar7 = QFontMetrics::horizontalAdvance((QString *)&fm,iVar8);
    (**(code **)(*plVar2 + 0xd8))(&opt,plVar2,plVar2 + 0x5c);
    qVar5 = local_b8.size;
    pcVar4 = local_b8.ptr;
    pDVar3 = local_b8.d;
    local_b8.d = (Data *)opt.super_QStyleOptionComplex.super_QStyleOption._0_8_;
    local_b8.ptr = (char16_t *)opt.super_QStyleOptionComplex.super_QStyleOption._8_8_;
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = pDVar3;
    opt.super_QStyleOptionComplex.super_QStyleOption._8_8_ = pcVar4;
    local_b8.size._0_4_ = opt.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i;
    local_b8.size._4_4_ = opt.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i;
    qVar6 = local_b8.size;
    local_b8.size._0_4_ = (undefined4)qVar5;
    local_b8.size._4_4_ = SUB84(qVar5,4);
    opt.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i = (undefined4)local_b8.size;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i = local_b8.size._4_4_;
    local_b8.size = qVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
    QString::truncate((longlong)&local_b8);
    QString::append((QString *)&local_b8);
    iVar8 = QFontMetrics::horizontalAdvance((QString *)&fm,iVar8);
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    iVar7 = 0;
    if (0 < iVar8) {
      iVar7 = iVar8;
    }
    if (plVar2[0x53] != 0) {
      QString::operator=((QString *)&local_b8,(QString *)(plVar2 + 0x51));
      iVar8 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_b8);
      if (iVar7 <= iVar8) {
        iVar7 = iVar8;
      }
    }
    opt._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.palette.d =
         (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionSpinBox::QStyleOptionSpinBox(&opt);
    (**(code **)(*(long *)this + 0x1c0))(this,&opt);
    local_e0 = iVar7 + 2;
    local_dc = extraout_var;
    pQVar9 = QWidget::style((QWidget *)this);
    lVar10 = (**(code **)(*(long *)pQVar9 + 0xe8))(pQVar9,0xf,&opt,&local_e0,this);
    plVar2[0x6e] = lVar10;
    QStyleOption::~QStyleOption((QStyleOption *)&opt);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QFontMetrics::~QFontMetrics(&fm);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(QSize *)(plVar2 + 0x6e);
  }
  __stack_chk_fail();
}

Assistant:

QSize QAbstractSpinBox::minimumSizeHint() const
{
    Q_D(const QAbstractSpinBox);
    if (d->cachedMinimumSizeHint.isEmpty()) {
        //Use the prefix and range to calculate the minimumSizeHint
        ensurePolished();

        const QFontMetrics fm(fontMetrics());
        int h = d->edit->minimumSizeHint().height();
        int w = 0;

        QString s;
        QString fixedContent =  d->prefix + u' ';
        s = d->textFromValue(d->minimum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));
        s = d->textFromValue(d->maximum);
        s.truncate(18);
        s += fixedContent;
        w = qMax(w, fm.horizontalAdvance(s));

        if (d->specialValueText.size()) {
            s = d->specialValueText;
            w = qMax(w, fm.horizontalAdvance(s));
        }
        w += 2; // cursor blinking space

        QStyleOptionSpinBox opt;
        initStyleOption(&opt);
        QSize hint(w, h);

        d->cachedMinimumSizeHint = style()->sizeFromContents(QStyle::CT_SpinBox, &opt, hint, this);
    }
    return d->cachedMinimumSizeHint;
}